

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BubbleJson.cpp
# Opt level: O3

ParseResults __thiscall
bubbleJson::BubbleJson::ParseObject(BubbleJson *this,BubbleValue *bubbleValue)

{
  _Rb_tree_node_base *p_Var1;
  BubbleContext *pBVar2;
  char *pcVar3;
  BubbleContext *pBVar4;
  ParseResults PVar5;
  char *p;
  byte *pbVar6;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,bubbleJson::BubbleValue>,std::_Select1st<std::pair<std::__cxx11::string_const,bubbleJson::BubbleValue>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bubbleJson::BubbleValue>>>
  *this_00;
  _Rb_tree_node_base *p_Var7;
  int iVar8;
  string string;
  size_t length;
  char *c_str;
  BubbleValue valueTmp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  size_t local_58;
  char *local_50;
  BubbleValue local_48;
  
  pBVar2 = this->context;
  if (*pBVar2->json != '{') {
    __assert_fail("*this->context->json == expectChar",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/BubbleJSON/BubbleJson.cpp"
                  ,0x38,"void bubbleJson::BubbleJson::Expect(const char)");
  }
  pbVar6 = (byte *)(pBVar2->json + 1);
  pBVar2->json = (char *)pbVar6;
  while (((ulong)*pbVar6 < 0x21 && ((0x100002600U >> ((ulong)*pbVar6 & 0x3f) & 1) != 0))) {
    pbVar6 = pbVar6 + 1;
  }
  pBVar2->json = (char *)pbVar6;
  this_00 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,bubbleJson::BubbleValue>,std::_Select1st<std::pair<std::__cxx11::string_const,bubbleJson::BubbleValue>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bubbleJson::BubbleValue>>>
             *)operator_new(0x30);
  p_Var1 = (_Rb_tree_node_base *)(this_00 + 8);
  *(undefined4 *)(this_00 + 8) = 0;
  PVar5 = ParseResult_Ok;
  *(undefined8 *)(this_00 + 0x10) = 0;
  *(_Rb_tree_node_base **)(this_00 + 0x18) = p_Var1;
  *(_Rb_tree_node_base **)(this_00 + 0x20) = p_Var1;
  *(undefined8 *)(this_00 + 0x28) = 0;
  (bubbleValue->u).string.literal = (char *)this_00;
  pcVar3 = pBVar2->json;
  if (*pcVar3 == '}') {
    bubbleValue->type = ValueType_Object;
    pBVar2->json = pcVar3 + 1;
  }
  else {
    do {
      if (*pBVar2->json != '\"') {
        PVar5 = ParseResult_MissKey;
        goto LAB_0010f834;
      }
      PVar5 = ParseStringRaw(this,&local_50,&local_58);
      if (PVar5 != ParseResult_Ok) goto LAB_0010f834;
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_78,local_50,local_50 + local_58);
      pBVar4 = this->context;
      pbVar6 = (byte *)pBVar4->json;
      while (((ulong)*pbVar6 < 0x21 && ((0x100002600U >> ((ulong)*pbVar6 & 0x3f) & 1) != 0))) {
        pbVar6 = pbVar6 + 1;
      }
      pBVar4->json = (char *)pbVar6;
      if (*pBVar2->json == ':') {
        pBVar2->json = pBVar2->json + 1;
        pbVar6 = (byte *)pBVar4->json;
        while (((ulong)*pbVar6 < 0x21 && ((0x100002600U >> ((ulong)*pbVar6 & 0x3f) & 1) != 0))) {
          pbVar6 = pbVar6 + 1;
        }
        pBVar4->json = (char *)pbVar6;
        BubbleValue::BubbleValue(&local_48);
        PVar5 = ParseValue(this,&local_48);
        iVar8 = 3;
        if (PVar5 == ParseResult_Ok) {
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,bubbleJson::BubbleValue>,std::_Select1st<std::pair<std::__cxx11::string_const,bubbleJson::BubbleValue>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bubbleJson::BubbleValue>>>
          ::_M_emplace_unique<std::__cxx11::string&,bubbleJson::BubbleValue&>
                    (this_00,&local_78,&local_48);
          pBVar4 = this->context;
          pbVar6 = (byte *)pBVar4->json;
          while (((ulong)*pbVar6 < 0x21 && ((0x100002600U >> ((ulong)*pbVar6 & 0x3f) & 1) != 0))) {
            pbVar6 = pbVar6 + 1;
          }
          pBVar4->json = (char *)pbVar6;
          pcVar3 = pBVar2->json;
          if (*pcVar3 == '}') {
            pBVar2->json = pcVar3 + 1;
            bubbleValue->type = ValueType_Object;
            PVar5 = ParseResult_Ok;
            iVar8 = 1;
          }
          else {
            PVar5 = ParseResult_MissCommaOrCurlyBracket;
            if (*pcVar3 == ',') {
              pBVar2->json = pcVar3 + 1;
              pbVar6 = (byte *)pBVar4->json;
              while (((ulong)*pbVar6 < 0x21 && ((0x100002600U >> ((ulong)*pbVar6 & 0x3f) & 1) != 0))
                    ) {
                pbVar6 = pbVar6 + 1;
              }
              pBVar4->json = (char *)pbVar6;
              iVar8 = 0;
              PVar5 = ParseResult_Ok;
            }
          }
        }
        BubbleValue::~BubbleValue(&local_48);
      }
      else {
        PVar5 = ParseResult_MissColon;
        iVar8 = 3;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p);
      }
    } while (iVar8 == 0);
    if (iVar8 == 3) {
LAB_0010f834:
      for (p_Var7 = *(_Rb_tree_node_base **)(this_00 + 0x18); p_Var7 != p_Var1;
          p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
        BubbleValue::MemoryFreeValue((BubbleValue *)(p_Var7 + 2));
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>_>_>
                   *)this_00);
      operator_delete(this_00);
      (bubbleValue->u).number = 0.0;
    }
    else {
      PVar5 = ParseResult_Ok;
    }
  }
  return PVar5;
}

Assistant:

ParseResults BubbleJson::ParseObject(BubbleValue *bubbleValue)
{
    BubbleContext* c = this->context;
    ParseResults result;

    Expect('{');
    ParseWhitespace();

    map<string, BubbleValue>* members = new map<string, BubbleValue>;
    bubbleValue->u.object.members = members;

    if (*c->json == '}')
    {
        bubbleValue->type = ValueType_Object;
        c->json++;
        return ParseResult_Ok;
    }
    while (true)
    {
        char* c_str;
        size_t length;

        if (*c->json != '"')
        {
            result = ParseResult_MissKey;
            break;
        }
        if ((result = ParseStringRaw(&c_str, &length)) != ParseResult_Ok)
            break;
        string string(c_str,length);

        ParseWhitespace();
        if (*c->json == ':')
        {
            c->json++;
            ParseWhitespace();
        }
        else
        {
            result = ParseResult_MissColon;
            break;
        }

        BubbleValue valueTmp;
        if ((result = ParseValue(&valueTmp)) != ParseResult_Ok)
            break;
        members->emplace(string, valueTmp);

        ParseWhitespace();
        if (*c->json == ',')
        {
            c->json++;
            ParseWhitespace();
        }
        else if (*c->json == '}')
        {
            c->json++;
            bubbleValue->type = ValueType_Object;
            return ParseResult_Ok;
        }
        else
        {
            result = ParseResult_MissCommaOrCurlyBracket;
            break;
        }
    }

    for (auto it = members->begin(); it != members->end(); ++it)
    {
        //delete (it->first);
        it->second.MemoryFreeValue();
    }
    delete members;
    bubbleValue->u.object.members = nullptr;
    return result;
}